

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark3.cpp
# Opt level: O3

pair<std::shared_ptr<hwnet::Buffer>,_int> * __thiscall
Codecc::Decode(pair<std::shared_ptr<hwnet::Buffer>,_int> *__return_storage_ptr__,Codecc *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_t sVar2;
  element_type *peVar3;
  element_type eVar4;
  size_t sVar5;
  ulong uVar6;
  ulong l;
  ulong local_58;
  unsigned_long local_50;
  Buffer *local_48;
  Ptr b;
  
  sVar2 = this->r;
  uVar6 = this->w - sVar2;
  if (4 < uVar6) {
    peVar3 = (this->buffer).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    eVar4.ptr = ((peVar3->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->ptr;
    sVar5 = peVar3->b;
    l = (long)*(int *)(eVar4.ptr + sVar2 + sVar5) + 4;
    if (l <= uVar6) {
      local_50 = 0;
      local_48 = (Buffer *)0x0;
      local_58 = l;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<hwnet::Buffer,std::allocator<hwnet::Buffer>,unsigned_long&,unsigned_long&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b,&local_48,
                 (allocator<hwnet::Buffer> *)
                 ((long)&b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi + 7),&local_58,&local_50);
      hwnet::Buffer::Append(local_48,eVar4.ptr + sVar2 + sVar5,l);
      this->r = this->r + l;
      (__return_storage_ptr__->first).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_48;
      (__return_storage_ptr__->first).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &((b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->buff)
                    .super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
          __return_storage_ptr__->second = 0;
          if (b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            return __return_storage_ptr__;
          }
        }
        else {
          p_Var1 = &((b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->buff)
                    .super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          __return_storage_ptr__->second = 0;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   b.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        return __return_storage_ptr__;
      }
      goto LAB_00111f58;
    }
  }
  (__return_storage_ptr__->first).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->first).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00111f58:
  __return_storage_ptr__->second = 0;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Buffer::Ptr,int> Decode() {
		size_t size = this->w - this->r;
		//std::cout << "decode " << this->w << "," << this->r << std::endl; 
		if(size > 4) {
			char *ptr = this->buffer->BuffPtr() + this->r;
			size_t len = (size_t)*(int*)&ptr[0];//包体大小
			if(size >= len+4) {
				Buffer::Ptr b = Buffer::New(len+4);
				b->Append(ptr,len+4);

				//int len = *(int*)&b->BuffPtr()[0];
				//int no = *(int*)&b->BuffPtr()[4];
				//std::cout << len << "," << no << "," << Buffer::New(b,8,b->Len())->ToString()  << std::endl;

				this->r += (len+4);
				return std::make_pair(b,0);
			}
		}
		return std::make_pair(nullptr,0);
	}